

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::ControlStatementCase::init(ControlStatementCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *this_01;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_190;
  ControlStatementCase *local_10;
  ControlStatementCase *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_ShaderPerformanceCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<(&local_190,(char (*) [25])"Using additive blending.");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  iVar1 = deqp::gls::ShaderPerformanceCase::init(&this->super_ShaderPerformanceCase,ctx_00);
  return iVar1;
}

Assistant:

void init (void)
	{
		m_testCtx.getLog() << TestLog::Message << "Using additive blending." << TestLog::EndMessage;
		ShaderPerformanceCase::init();
	}